

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O3

ssl_open_record_t __thiscall
bssl::dtls1_open_handshake
          (bssl *this,SSL *ssl,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  byte *pbVar1;
  Span<unsigned_char> in_00;
  Span<const_unsigned_char> data;
  bool bVar2;
  ssl_open_record_t sVar3;
  int line;
  size_t *psVar4;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> record_00;
  uint8_t type;
  Span<unsigned_char> record;
  DTLSRecordNumber record_number;
  size_t in_stack_ffffffffffffffa8;
  undefined1 local_49;
  DTLSRecordNumber local_48;
  uchar *puStack_40;
  DTLSRecordNumber local_30;
  uint8_t *local_28;
  uchar *puStack_20;
  
  puStack_20 = in.data_;
  local_30.combined_ = 0;
  local_48.combined_ = 0;
  puStack_40 = (uchar *)0x0;
  in_00.size_ = in_stack_ffffffffffffffa8;
  in_00.data_ = puStack_20;
  psVar4 = out_consumed;
  local_28 = out_alert;
  sVar3 = dtls_open_record(this,(SSL *)&stack0xffffffffffffffb7,(uint8_t *)&stack0xffffffffffffffd0,
                           &stack0xffffffffffffffb8,(Span<unsigned_char> *)ssl,out_consumed,
                           out_alert,in_00);
  if (sVar3 != ssl_open_record_success) {
    return sVar3;
  }
  sVar3 = ssl_open_record_discard;
  switch(local_49) {
  case 0x14:
    if ((puStack_40 == (uchar *)0x1) && (*(char *)local_48.combined_ == '\x01')) {
      if (local_30.combined_._6_2_ == 0) {
        pbVar1 = *(byte **)(this + 0x38);
        if (*(short *)(pbVar1 + 8) != 0) {
          return ssl_open_record_discard;
        }
        *pbVar1 = *pbVar1 | 1;
        in_01.size_ = (size_t)psVar4;
        in_01.data_ = (uchar *)0x1;
        ssl_do_msg_callback(this,(SSL *)0x0,0x14,(int)local_48.combined_,in_01);
        return ssl_open_record_success;
      }
      line = 399;
      goto LAB_0016ed4d;
    }
    ERR_put_error(0x10,0,0x67,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,0x187);
    *(undefined1 *)out_consumed = 0x2f;
    goto LAB_0016ed78;
  default:
    line = 0x1ab;
LAB_0016ed4d:
    ERR_put_error(0x10,0,0xe1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_both.cc"
                  ,line);
    *(undefined1 *)out_consumed = 10;
LAB_0016ed78:
    sVar3 = ssl_open_record_error;
    break;
  case 0x16:
    record_00.size_ = (size_t)psVar4;
    record_00.data_ = puStack_40;
    bVar2 = dtls1_process_handshake_fragments
                      (this,(SSL *)out_consumed,(uint8_t *)local_30.combined_,local_48,record_00);
    sVar3 = (uint)!bVar2 << 2;
    break;
  case 0x17:
    break;
  case 0x1a:
    data.size_ = (size_t)puStack_40;
    data.data_ = (uchar *)local_48.combined_;
    sVar3 = dtls1_process_ack((SSL *)this,(uint8_t *)out_consumed,local_30,data);
  }
  return sVar3;
}

Assistant:

ssl_open_record_t dtls1_open_handshake(SSL *ssl, size_t *out_consumed,
                                       uint8_t *out_alert, Span<uint8_t> in) {
  uint8_t type;
  DTLSRecordNumber record_number;
  Span<uint8_t> record;
  auto ret = dtls_open_record(ssl, &type, &record_number, &record, out_consumed,
                              out_alert, in);
  if (ret != ssl_open_record_success) {
    return ret;
  }

  switch (type) {
    case SSL3_RT_APPLICATION_DATA:
      // In DTLS 1.2, out-of-order application data may be received between
      // ChangeCipherSpec and Finished. Discard it.
      return ssl_open_record_discard;

    case SSL3_RT_CHANGE_CIPHER_SPEC:
      if (record.size() != 1u || record[0] != SSL3_MT_CCS) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_CHANGE_CIPHER_SPEC);
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        return ssl_open_record_error;
      }

      // We do not support renegotiation, so encrypted ChangeCipherSpec records
      // are illegal.
      if (record_number.epoch() != 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
        *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
        return ssl_open_record_error;
      }

      // Ignore ChangeCipherSpec from a previous epoch.
      if (record_number.epoch() != ssl->d1->read_epoch.epoch) {
        return ssl_open_record_discard;
      }

      // Flag the ChangeCipherSpec for later.
      // TODO(crbug.com/42290594): Should we reject this in DTLS 1.3?
      ssl->d1->has_change_cipher_spec = true;
      ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_CHANGE_CIPHER_SPEC,
                          record);
      return ssl_open_record_success;

    case SSL3_RT_ACK:
      return dtls1_process_ack(ssl, out_alert, record_number, record);

    case SSL3_RT_HANDSHAKE:
      if (!dtls1_process_handshake_fragments(ssl, out_alert, record_number,
                                             record)) {
        return ssl_open_record_error;
      }
      return ssl_open_record_success;

    default:
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
  }
}